

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_connection_base.cpp
# Opt level: O3

int __thiscall libtorrent::aux::web_connection_base::timeout(web_connection_base *this)

{
  int iVar1;
  session_settings *psVar2;
  unique_lock<std::mutex> local_28;
  
  psVar2 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
  local_28._M_device = &psVar2->m_mutex;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar1 = (psVar2->m_store).m_ints._M_elems[0xb];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return iVar1;
}

Assistant:

int web_connection_base::timeout() const
	{
		// since this is a web seed, change the timeout
		// according to the settings.
		return m_settings.get_int(settings_pack::urlseed_timeout);
	}